

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O0

void __thiscall cppjieba::SegmentBase::SegmentBase(SegmentBase *this)

{
  bool bVar1;
  ostream *poVar2;
  Logger local_1c8;
  allocator local_31;
  string local_30 [32];
  SegmentBase *local_10;
  SegmentBase *this_local;
  
  this->_vptr_SegmentBase = (_func_int **)&PTR__SegmentBase_0013ec80;
  local_10 = this;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->symbols_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,anon_var_dwarf_1d741,&local_31);
  bVar1 = ResetSeparators(this,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    limonp::Logger::Logger
              (&local_1c8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/SegmentBase.hpp"
               ,0x12);
    poVar2 = limonp::Logger::Stream(&local_1c8);
    poVar2 = std::operator<<(poVar2,"exp: [ResetSeparators(SPECIAL_SEPARATORS)");
    std::operator<<(poVar2,"] false. ");
    limonp::Logger::~Logger(&local_1c8);
  }
  return;
}

Assistant:

SegmentBase() {
    XCHECK(ResetSeparators(SPECIAL_SEPARATORS));
  }